

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe local_e8;
  secp256k1_fe local_b8;
  secp256k1_fe local_88;
  secp256k1_fe t1;
  
  r->infinity = a->infinity;
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_mul_int(&r->z,2);
  secp256k1_fe_sqr(&t1,&a->x);
  t1.n[0] = t1.n[0] * 3;
  t1.n[1] = t1.n[1] * 3;
  t1.n[2] = t1.n[2] * 3;
  t1.n[3] = t1.n[3] * 3;
  t1.n[4] = t1.n[4] * 3;
  secp256k1_fe_sqr(&local_88,&t1);
  secp256k1_fe_sqr(&local_b8,&a->y);
  local_b8.n[0] = local_b8.n[0] * 2;
  local_b8.n[1] = local_b8.n[1] * 2;
  local_b8.n[2] = local_b8.n[2] * 2;
  local_b8.n[3] = local_b8.n[3] * 2;
  local_b8.n[4] = local_b8.n[4] << 1;
  secp256k1_fe_sqr(&local_e8,&local_b8);
  local_e8.n[0] = local_e8.n[0] * 2;
  local_e8.n[1] = local_e8.n[1] * 2;
  local_e8.n[2] = local_e8.n[2] * 2;
  local_e8.n[3] = local_e8.n[3] * 2;
  local_e8.n[4] = local_e8.n[4] << 1;
  secp256k1_fe_mul(&local_b8,&local_b8,&a->x);
  (r->x).n[4] = local_b8.n[4];
  (r->x).n[2] = local_b8.n[2];
  (r->x).n[3] = local_b8.n[3];
  (r->x).n[0] = local_b8.n[0];
  (r->x).n[1] = local_b8.n[1];
  secp256k1_fe_mul_int(&r->x,4);
  secp256k1_fe_negate(&r->x,&r->x,4);
  secp256k1_fe_add(&r->x,&local_88);
  local_88.n[0] = 0x3ffffbfffff0bc - local_88.n[0];
  local_88.n[1] = 0x3ffffffffffffc - local_88.n[1];
  local_88.n[2] = 0x3ffffffffffffc - local_88.n[2];
  local_88.n[3] = 0x3ffffffffffffc - local_88.n[3];
  local_88.n[4] = 0x3fffffffffffc - local_88.n[4];
  local_b8.n[0] = local_b8.n[0] * 6 + local_88.n[0];
  local_b8.n[1] = local_b8.n[1] * 6 + local_88.n[1];
  local_b8.n[2] = local_b8.n[2] * 6 + local_88.n[2];
  local_b8.n[3] = local_b8.n[3] * 6 + local_88.n[3];
  local_b8.n[4] = local_b8.n[4] * 6 + local_88.n[4];
  secp256k1_fe_mul(&r->y,&t1,&local_b8);
  local_88.n[0] = 0x5ffff9ffffe91a - local_e8.n[0];
  local_88.n[1] = 0x5ffffffffffffa - local_e8.n[1];
  local_88.n[2] = 0x5ffffffffffffa - local_e8.n[2];
  local_88.n[3] = 0x5ffffffffffffa - local_e8.n[3];
  local_88.n[4] = 0x5fffffffffffa - local_e8.n[4];
  secp256k1_fe_add(&r->y,&local_88);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 0 normalize, 12 mul_int/add/negate.
     *
     * Note that there is an implementation described at
     *     https://hyperelliptic.org/EFD/g1p/auto-shortw-jacobian-0.html#doubling-dbl-2009-l
     * which trades a multiply for a square, but in practice this is actually slower,
     * mainly because it requires more normalizations.
     */
    secp256k1_fe t1,t2,t3,t4;

    r->infinity = a->infinity;

    secp256k1_fe_mul(&r->z, &a->z, &a->y);
    secp256k1_fe_mul_int(&r->z, 2);       /* Z' = 2*Y*Z (2) */
    secp256k1_fe_sqr(&t1, &a->x);
    secp256k1_fe_mul_int(&t1, 3);         /* T1 = 3*X^2 (3) */
    secp256k1_fe_sqr(&t2, &t1);           /* T2 = 9*X^4 (1) */
    secp256k1_fe_sqr(&t3, &a->y);
    secp256k1_fe_mul_int(&t3, 2);         /* T3 = 2*Y^2 (2) */
    secp256k1_fe_sqr(&t4, &t3);
    secp256k1_fe_mul_int(&t4, 2);         /* T4 = 8*Y^4 (2) */
    secp256k1_fe_mul(&t3, &t3, &a->x);    /* T3 = 2*X*Y^2 (1) */
    r->x = t3;
    secp256k1_fe_mul_int(&r->x, 4);       /* X' = 8*X*Y^2 (4) */
    secp256k1_fe_negate(&r->x, &r->x, 4); /* X' = -8*X*Y^2 (5) */
    secp256k1_fe_add(&r->x, &t2);         /* X' = 9*X^4 - 8*X*Y^2 (6) */
    secp256k1_fe_negate(&t2, &t2, 1);     /* T2 = -9*X^4 (2) */
    secp256k1_fe_mul_int(&t3, 6);         /* T3 = 12*X*Y^2 (6) */
    secp256k1_fe_add(&t3, &t2);           /* T3 = 12*X*Y^2 - 9*X^4 (8) */
    secp256k1_fe_mul(&r->y, &t1, &t3);    /* Y' = 36*X^3*Y^2 - 27*X^6 (1) */
    secp256k1_fe_negate(&t2, &t4, 2);     /* T2 = -8*Y^4 (3) */
    secp256k1_fe_add(&r->y, &t2);         /* Y' = 36*X^3*Y^2 - 27*X^6 - 8*Y^4 (4) */
}